

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O3

_Bool BinarySource_get_bool(BinarySource *src)

{
  size_t sVar1;
  
  if (src->err == BSE_NO_ERROR) {
    sVar1 = src->pos;
    if (src->len != sVar1) {
      src->pos = sVar1 + 1;
      return *(char *)((long)src->data + sVar1) != '\0';
    }
    src->err = BSE_OUT_OF_DATA;
  }
  return false;
}

Assistant:

static bool BinarySource_data_avail(BinarySource *src, size_t wanted)
{
    if (src->err)
        return false;

    if (wanted <= src->len - src->pos)
        return true;

    src->err = BSE_OUT_OF_DATA;
    return false;
}